

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O2

void setup_joystick_values(ALLEGRO_JOYSTICK *joy)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  float (*pafVar5) [3];
  ALLEGRO_JOYSTICK_STATE *pAVar6;
  ulong uVar7;
  ALLEGRO_JOYSTICK_STATE jst;
  
  if (joy == (ALLEGRO_JOYSTICK *)0x0) {
    num_sticks = 0;
    num_buttons = 0;
    return;
  }
  pAVar6 = &jst;
  al_get_joystick_state(joy,pAVar6);
  iVar1 = al_get_joystick_num_sticks(joy);
  num_sticks = 0x10;
  if (iVar1 < 0x10) {
    num_sticks = iVar1;
  }
  pafVar5 = joys;
  for (uVar7 = 0; (long)uVar7 < (long)num_sticks; uVar7 = uVar7 + 1) {
    uVar2 = al_get_joystick_num_axes(joy,uVar7 & 0xffffffff);
    num_axes[uVar7] = uVar2;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = 0;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      (*pafVar5)[uVar4] = pAVar6->stick[0].axis[uVar4];
    }
    pAVar6 = (ALLEGRO_JOYSTICK_STATE *)(pAVar6->stick + 1);
    pafVar5 = pafVar5 + 1;
  }
  uVar2 = al_get_joystick_num_buttons(joy);
  num_buttons = 0x20;
  if ((int)uVar2 < 0x20) {
    num_buttons = uVar2;
  }
  uVar3 = 0;
  uVar7 = (ulong)(uint)num_buttons;
  if (num_buttons < 1) {
    uVar7 = uVar3;
  }
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    joys_buttons[uVar3] = 0x3fff < jst.button[uVar3];
  }
  return;
}

Assistant:

static void setup_joystick_values(ALLEGRO_JOYSTICK *joy)
{
   ALLEGRO_JOYSTICK_STATE jst;
   int i, j;

   if (joy == NULL) {
      num_sticks = 0;
      num_buttons = 0;
      return;
   }

   al_get_joystick_state(joy, &jst);

   num_sticks = al_get_joystick_num_sticks(joy);
   if (num_sticks > MAX_STICKS)
      num_sticks = MAX_STICKS;
   for (i = 0; i < num_sticks; i++) {
      num_axes[i] = al_get_joystick_num_axes(joy, i);
      for (j = 0; j < num_axes[i]; ++j)
         joys[i][j] = jst.stick[i].axis[j];
   }

   num_buttons = al_get_joystick_num_buttons(joy);
   if (num_buttons > MAX_BUTTONS) {
      num_buttons = MAX_BUTTONS;
   }
   for (i = 0; i < num_buttons; i++) {
      joys_buttons[i] = (jst.button[i] >= 16384);
   }
}